

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O2

int xmlACatalogAdd(xmlCatalogPtr catal,xmlChar *type,xmlChar *orig,xmlChar *replace)

{
  _xmlCatalogEntry **pp_Var1;
  xmlGenericErrorFunc p_Var2;
  xmlCatalogEntryType xVar3;
  _xmlCatalogEntry *p_Var4;
  int iVar5;
  xmlCatalogEntryPtr pxVar6;
  xmlHashTablePtr table;
  xmlGenericErrorFunc *pp_Var7;
  void **ppvVar8;
  xmlCatalogEntryPtr pxVar9;
  void *pvVar10;
  xmlChar *pxVar11;
  _xmlCatalogEntry *p_Var12;
  bool bVar13;
  
  iVar5 = -1;
  if (catal != (xmlCatalogPtr)0x0) {
    if (catal->type != XML_XML_CATALOG_TYPE) {
      iVar5 = xmlStrEqual(type,"SYSTEM");
      if (iVar5 == 0) {
        iVar5 = xmlStrEqual(type,(xmlChar *)"PUBLIC");
        if (iVar5 == 0) {
          iVar5 = xmlStrEqual(type,(xmlChar *)"DELEGATE");
          if (iVar5 == 0) {
            iVar5 = xmlStrEqual(type,"ENTITY");
            if (iVar5 == 0) {
              iVar5 = xmlStrEqual(type,(xmlChar *)"DOCTYPE");
              if (iVar5 == 0) {
                iVar5 = xmlStrEqual(type,(xmlChar *)"LINKTYPE");
                if (iVar5 == 0) {
                  iVar5 = xmlStrEqual(type,(xmlChar *)"NOTATION");
                  if (iVar5 == 0) {
                    iVar5 = xmlStrEqual(type,(xmlChar *)"SGMLDECL");
                    if (iVar5 == 0) {
                      iVar5 = xmlStrEqual(type,"DOCUMENT");
                      if (iVar5 == 0) {
                        iVar5 = xmlStrEqual(type,"CATALOG");
                        if (iVar5 == 0) {
                          iVar5 = xmlStrEqual(type,(xmlChar *)"BASE");
                          if (iVar5 == 0) {
                            return -1;
                          }
                          xVar3 = SGML_CATA_BASE;
                        }
                        else {
                          xVar3 = SGML_CATA_CATALOG;
                        }
                      }
                      else {
                        xVar3 = SGML_CATA_DOCUMENT;
                      }
                    }
                    else {
                      xVar3 = SGML_CATA_SGMLDECL;
                    }
                  }
                  else {
                    xVar3 = SGML_CATA_NOTATION;
                  }
                }
                else {
                  xVar3 = SGML_CATA_LINKTYPE;
                }
              }
              else {
                xVar3 = SGML_CATA_DOCTYPE;
              }
            }
            else {
              xVar3 = SGML_CATA_ENTITY;
            }
          }
          else {
            xVar3 = SGML_CATA_DELEGATE;
          }
        }
        else {
          xVar3 = SGML_CATA_PUBLIC;
        }
      }
      else {
        xVar3 = SGML_CATA_SYSTEM;
      }
      pxVar6 = xmlNewCatalogEntry(xVar3,orig,replace,(xmlChar *)0x0,XML_CATA_PREFER_NONE,
                                  (xmlCatalogEntryPtr)0x0);
      table = catal->sgml;
      if (table == (xmlHashTablePtr)0x0) {
        table = xmlHashCreate(10);
        catal->sgml = table;
      }
      iVar5 = xmlHashAddEntry(table,orig,pxVar6);
      return iVar5;
    }
    pxVar6 = catal->xml;
    if ((pxVar6 != (xmlCatalogEntryPtr)0x0) && ((uint)(pxVar6->type + XML_CATA_REMOVED) < 2)) {
      if (pxVar6->children == (_xmlCatalogEntry *)0x0) {
        xmlFetchXMLCatalogFile(pxVar6);
        bVar13 = pxVar6->children == (_xmlCatalogEntry *)0x0;
      }
      else {
        bVar13 = false;
      }
      iVar5 = xmlStrEqual(type,"system");
      if (iVar5 == 0) {
        iVar5 = xmlStrEqual(type,(xmlChar *)"public");
        if (iVar5 == 0) {
          iVar5 = xmlStrEqual(type,(xmlChar *)"rewriteSystem");
          if (iVar5 == 0) {
            iVar5 = xmlStrEqual(type,(xmlChar *)"delegatePublic");
            if (iVar5 == 0) {
              iVar5 = xmlStrEqual(type,(xmlChar *)"delegateSystem");
              if (iVar5 == 0) {
                iVar5 = xmlStrEqual(type,"uri");
                if (iVar5 == 0) {
                  iVar5 = xmlStrEqual(type,(xmlChar *)"rewriteURI");
                  if (iVar5 == 0) {
                    iVar5 = xmlStrEqual(type,(xmlChar *)"delegateURI");
                    if (iVar5 == 0) {
                      iVar5 = xmlStrEqual(type,(xmlChar *)"nextCatalog");
                      if (iVar5 == 0) {
                        iVar5 = xmlStrEqual(type,"catalog");
                        if (iVar5 == 0) {
                          if (xmlDebugCatalogs == 0) {
                            return -1;
                          }
                          pp_Var7 = __xmlGenericError();
                          p_Var2 = *pp_Var7;
                          ppvVar8 = __xmlGenericErrorContext();
                          (*p_Var2)(*ppvVar8,"Failed to add unknown element %s to catalog\n",type);
                          return -1;
                        }
                        xVar3 = XML_CATA_CATALOG;
                      }
                      else {
                        xVar3 = XML_CATA_NEXT_CATALOG;
                      }
                    }
                    else {
                      xVar3 = XML_CATA_DELEGATE_URI;
                    }
                  }
                  else {
                    xVar3 = XML_CATA_REWRITE_URI;
                  }
                }
                else {
                  xVar3 = XML_CATA_URI;
                }
              }
              else {
                xVar3 = XML_CATA_DELEGATE_SYSTEM;
              }
            }
            else {
              xVar3 = XML_CATA_DELEGATE_PUBLIC;
            }
          }
          else {
            xVar3 = XML_CATA_REWRITE_SYSTEM;
          }
        }
        else {
          xVar3 = XML_CATA_PUBLIC;
        }
      }
      else {
        xVar3 = XML_CATA_SYSTEM;
      }
      pp_Var1 = &pxVar6->children;
      p_Var4 = *pp_Var1;
      if (*pp_Var1 == (_xmlCatalogEntry *)0x0) {
        p_Var12 = (_xmlCatalogEntry *)0x0;
      }
      else {
        do {
          p_Var12 = p_Var4;
          if (((orig != (xmlChar *)0x0) && (p_Var12->type == xVar3)) &&
             (iVar5 = xmlStrEqual(orig,p_Var12->name), iVar5 != 0)) {
            if (xmlDebugCatalogs != 0) {
              pp_Var7 = __xmlGenericError();
              p_Var2 = *pp_Var7;
              ppvVar8 = __xmlGenericErrorContext();
              (*p_Var2)(*ppvVar8,"Updating element %s to catalog\n",type);
            }
            if (p_Var12->value != (xmlChar *)0x0) {
              (*xmlFree)(p_Var12->value);
            }
            if (p_Var12->URL != (xmlChar *)0x0) {
              (*xmlFree)(p_Var12->URL);
            }
            pxVar11 = xmlStrdup(replace);
            p_Var12->value = pxVar11;
            pxVar11 = xmlStrdup(replace);
            p_Var12->URL = pxVar11;
            return 0;
          }
          p_Var4 = p_Var12->next;
        } while (p_Var12->next != (_xmlCatalogEntry *)0x0);
      }
      if (xmlDebugCatalogs != 0) {
        pp_Var7 = __xmlGenericError();
        p_Var2 = *pp_Var7;
        ppvVar8 = __xmlGenericErrorContext();
        (*p_Var2)(*ppvVar8,"Adding element %s to catalog\n",type);
      }
      iVar5 = 0;
      pxVar9 = xmlNewCatalogEntry(xVar3,orig,replace,(xmlChar *)0x0,pxVar6->prefer,
                                  (xmlCatalogEntryPtr)0x0);
      if (p_Var12 == (_xmlCatalogEntry *)0x0) {
        p_Var12 = (_xmlCatalogEntry *)pp_Var1;
      }
      p_Var12->next = pxVar9;
      if (bVar13) {
        pxVar6->type = XML_CATA_CATALOG;
        pvVar10 = xmlHashLookup(xmlCatalogXMLFiles,pxVar6->URL);
        if (pvVar10 != (void *)0x0) {
          *(_xmlCatalogEntry **)((long)pvVar10 + 0x10) = *pp_Var1;
        }
      }
    }
  }
  return iVar5;
}

Assistant:

int
xmlACatalogAdd(xmlCatalogPtr catal, const xmlChar * type,
              const xmlChar * orig, const xmlChar * replace)
{
    int res = -1;

    if (catal == NULL)
	return(-1);

    if (catal->type == XML_XML_CATALOG_TYPE) {
        res = xmlAddXMLCatalog(catal->xml, type, orig, replace);
    } else {
        xmlCatalogEntryType cattype;

        cattype = xmlGetSGMLCatalogEntryType(type);
        if (cattype != XML_CATA_NONE) {
            xmlCatalogEntryPtr entry;

            entry = xmlNewCatalogEntry(cattype, orig, replace, NULL,
                                       XML_CATA_PREFER_NONE, NULL);
	    if (catal->sgml == NULL)
		catal->sgml = xmlHashCreate(10);
            res = xmlHashAddEntry(catal->sgml, orig, entry);
        }
    }
    return (res);
}